

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_api.cpp
# Opt level: O2

void __thiscall cppcms::impl::cgi::http::on_async_write_start(http *this)

{
  element_type *peVar1;
  undefined1 auStack_38 [24];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  update_time(this);
  peVar1 = (this->watchdog_).
           super___shared_ptr<cppcms::impl::cgi::http_watchdog,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  self((http *)auStack_38);
  std::__weak_ptr<cppcms::impl::cgi::http,(__gnu_cxx::_Lock_policy)2>::
  __weak_ptr<cppcms::impl::cgi::http,void>
            ((__weak_ptr<cppcms::impl::cgi::http,(__gnu_cxx::_Lock_policy)2> *)(auStack_38 + 0x10),
             (__shared_ptr<cppcms::impl::cgi::http,_(__gnu_cxx::_Lock_policy)2> *)auStack_38);
  std::
  _Rb_tree<std::weak_ptr<cppcms::impl::cgi::http>,std::weak_ptr<cppcms::impl::cgi::http>,std::_Identity<std::weak_ptr<cppcms::impl::cgi::http>>,std::owner_less<std::weak_ptr<cppcms::impl::cgi::http>>,std::allocator<std::weak_ptr<cppcms::impl::cgi::http>>>
  ::_M_insert_unique<std::weak_ptr<cppcms::impl::cgi::http>const&>
            ((_Rb_tree<std::weak_ptr<cppcms::impl::cgi::http>,std::weak_ptr<cppcms::impl::cgi::http>,std::_Identity<std::weak_ptr<cppcms::impl::cgi::http>>,std::owner_less<std::weak_ptr<cppcms::impl::cgi::http>>,std::allocator<std::weak_ptr<cppcms::impl::cgi::http>>>
              *)&peVar1->connections_,(weak_ptr<cppcms::impl::cgi::http> *)(auStack_38 + 0x10));
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_38 + 8));
  return;
}

Assistant:

void on_async_write_start()
		{
			update_time();
			watchdog_->add(self());
		}